

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCompactProtocol.h
# Opt level: O1

shared_ptr<duckdb_apache::thrift::protocol::TProtocol> __thiscall
duckdb_apache::thrift::protocol::TCompactProtocolFactoryT<duckdb::SimpleReadTransport>::getProtocol
          (TCompactProtocolFactoryT<duckdb::SimpleReadTransport> *this,
          shared_ptr<duckdb_apache::thrift::transport::TTransport> *trans)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  TCompactProtocolT<duckdb::SimpleReadTransport> *this_01;
  long *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<duckdb_apache::thrift::protocol::TProtocol> sVar3;
  shared_ptr<duckdb_apache::thrift::transport::TTransport> local_50;
  shared_ptr<duckdb::SimpleReadTransport> local_40;
  
  peVar1 = (element_type *)*in_RDX;
  this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_00->_M_use_count = this_00->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_00->_M_use_count = this_00->_M_use_count + 1;
    }
  }
  if (peVar1 == (element_type *)0x0) {
    this_01 = (TCompactProtocolT<duckdb::SimpleReadTransport> *)operator_new(0xb0);
    local_50.
    super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)*in_RDX;
    local_50.
    super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
    if (local_50.
        super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_50.
         super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_50.
              super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_50.
         super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi)->_M_use_count =
             (local_50.
              super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    TCompactProtocolT<duckdb_apache::thrift::transport::TTransport>::TCompactProtocolT
              ((TCompactProtocolT<duckdb_apache::thrift::transport::TTransport> *)this_01,&local_50,
               *(int32_t *)
                &(trans->
                 super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
                 )._M_refcount._M_pi,
               *(int32_t *)
                ((long)&(trans->
                        super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
                        )._M_refcount._M_pi + 4));
    _Var2._M_pi = local_50.
                  super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
  }
  else {
    this_01 = (TCompactProtocolT<duckdb::SimpleReadTransport> *)operator_new(0xb0);
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    local_40.super___shared_ptr<duckdb::SimpleReadTransport,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar1;
    local_40.super___shared_ptr<duckdb::SimpleReadTransport,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = this_00;
    TCompactProtocolT<duckdb::SimpleReadTransport>::TCompactProtocolT
              (this_01,&local_40,
               *(int32_t *)
                &(trans->
                 super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
                 )._M_refcount._M_pi,
               *(int32_t *)
                ((long)&(trans->
                        super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
                        )._M_refcount._M_pi + 4));
    _Var2._M_pi = local_40.
                  super___shared_ptr<duckdb::SimpleReadTransport,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
  }
  if (_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var2._M_pi);
  }
  (this->super_TProtocolFactory)._vptr_TProtocolFactory = (_func_int **)this_01;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb_apache::thrift::protocol::TProtocol*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&this->string_limit_,(TProtocol *)this_01
            );
  _Var2._M_pi = extraout_RDX;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    _Var2._M_pi = extraout_RDX_00;
  }
  sVar3.super___shared_ptr<duckdb_apache::thrift::protocol::TProtocol,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var2._M_pi;
  sVar3.super___shared_ptr<duckdb_apache::thrift::protocol::TProtocol,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (shared_ptr<duckdb_apache::thrift::protocol::TProtocol>)
         sVar3.
         super___shared_ptr<duckdb_apache::thrift::protocol::TProtocol,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<TProtocol> getProtocol(std::shared_ptr<TTransport> trans) override {
    std::shared_ptr<Transport_> specific_trans = std::static_pointer_cast<Transport_>(trans);
    TProtocol* prot;
    if (specific_trans) {
      prot = new TCompactProtocolT<Transport_>(specific_trans, string_limit_, container_limit_);
    } else {
      prot = new TCompactProtocol(trans, string_limit_, container_limit_);
    }

    return std::shared_ptr<TProtocol>(prot);
  }